

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_iterator.cpp
# Opt level: O0

bool __thiscall QFSFileEngineIterator::advance(QFSFileEngineIterator *this)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QFileSystemMetaData data;
  QFileSystemEntry entry;
  QFileInfoPrivate *in_stack_ffffffffffffff08;
  QFileSystemMetaData *in_stack_ffffffffffffff10;
  bool local_91;
  QFileSystemMetaData *metaData;
  QFileSystemEntry *fileEntry;
  QFileSystemIterator *this_00;
  QFileSystemMetaData *data_00;
  QFileSystemEntry *file;
  QFileInfoPrivate *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_> *)
                     0x2c1ab4);
  if (bVar2) {
    file = (QFileSystemEntry *)&DAT_aaaaaaaaaaaaaaaa;
    this_01 = (QFileInfoPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    data_00 = (QFileSystemMetaData *)&DAT_aaaaaaaaaaaaaaaa;
    QFileSystemEntry::QFileSystemEntry((QFileSystemEntry *)in_stack_ffffffffffffff10);
    fileEntry = (QFileSystemEntry *)&DAT_aaaaaaaaaaaaaaaa;
    this_00 = (QFileSystemIterator *)&DAT_aaaaaaaaaaaaaaaa;
    metaData = (QFileSystemMetaData *)&DAT_aaaaaaaaaaaaaaaa;
    QFileSystemMetaData::QFileSystemMetaData(in_stack_ffffffffffffff10);
    std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>::operator->
              ((unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_> *)
               0x2c1b4b);
    local_91 = QFileSystemIterator::advance(this_00,fileEntry,metaData);
    if (local_91) {
      operator_new(0x1e8);
      QFileInfoPrivate::QFileInfoPrivate(this_01,file,data_00);
      QFileInfo::QFileInfo((QFileInfo *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      QFileInfo::operator=
                ((QFileInfo *)in_stack_ffffffffffffff10,(QFileInfo *)in_stack_ffffffffffffff08);
      QFileInfo::~QFileInfo((QFileInfo *)0x2c1bcb);
    }
    else {
      std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>::reset
                ((unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_> *)
                 in_stack_ffffffffffffff10,(pointer)in_stack_ffffffffffffff08);
    }
    QFileSystemEntry::~QFileSystemEntry((QFileSystemEntry *)in_stack_ffffffffffffff10);
  }
  else {
    local_91 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_91;
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEngineIterator::advance()
{
    if (!nativeIterator)
        return false;

    QFileSystemEntry entry;
    QFileSystemMetaData data;
    if (nativeIterator->advance(entry, data)) {
        m_fileInfo = QFileInfo(new QFileInfoPrivate(entry, data));
        return true;
    } else {
        nativeIterator.reset();
        return false;
    }
}